

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUnit.h
# Opt level: O2

void __thiscall
QUnit::UnitTest::evaluate
          (UnitTest *this,bool compare,bool result,string *val1,string *val2,string *str1,
          string *str2,char *file,int line,char *func)

{
  undefined4 uVar1;
  undefined4 uVar2;
  string *psVar3;
  __type _Var4;
  ostream *poVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  char *pcVar7;
  string cmp;
  allocator local_69;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50 [32];
  
  local_60 = str1;
  if ((int)CONCAT71(in_register_00000011,result) == 0) {
    _Var4 = std::operator!=(val1,val2);
  }
  else {
    _Var4 = std::operator==(val1,val2);
  }
  uVar1 = this->errors_;
  uVar2 = this->tests_;
  this->errors_ = (uint)(_Var4 ^ 1) + uVar1;
  this->tests_ = uVar2 + 1;
  if (this->verboseLevel_ != 0 && (this->verboseLevel_ < 3 & _Var4) == 0) {
    local_68 = val1;
    local_58 = val2;
    poVar5 = std::operator<<(this->out_,file);
    pcVar6 = ":";
    if (_Var4 != false) {
      pcVar6 = ";";
    }
    pcVar7 = "FAILED/";
    if (_Var4 != false) {
      pcVar7 = "OK/";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,line);
    std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(this->out_,pcVar7);
    poVar5 = std::operator<<(poVar5,func);
    std::operator<<(poVar5,"(): ");
    if (compare) {
      pcVar6 = "!=";
      if (result) {
        pcVar6 = "==";
      }
      std::__cxx11::string::string(local_50,pcVar6,&local_69);
      poVar5 = std::operator<<(this->out_,"compare {");
      psVar3 = local_68;
      poVar5 = std::operator<<(poVar5,(string *)local_60);
      poVar5 = std::operator<<(poVar5,"} ");
      poVar5 = std::operator<<(poVar5,local_50);
      poVar5 = std::operator<<(poVar5," {");
      poVar5 = std::operator<<(poVar5,(string *)str2);
      poVar5 = std::operator<<(poVar5,"} ");
      poVar5 = std::operator<<(poVar5,"got {\"");
      poVar5 = std::operator<<(poVar5,(string *)psVar3);
      poVar5 = std::operator<<(poVar5,"\"} ");
      poVar5 = std::operator<<(poVar5,local_50);
      poVar5 = std::operator<<(poVar5," {\"");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      std::operator<<(poVar5,"\"}");
      std::__cxx11::string::~string(local_50);
    }
    else {
      poVar5 = std::operator<<(this->out_,"evaluate {");
      poVar5 = std::operator<<(poVar5,(string *)local_60);
      poVar5 = std::operator<<(poVar5,"} == ");
      std::operator<<(poVar5,(string *)local_68);
    }
    std::endl<char,std::char_traits<char>>(this->out_);
  }
  return;
}

Assistant:

inline void UnitTest::evaluate(
        bool compare, bool result,
        std::string val1, std::string val2,
        std::string str1, std::string str2,
        const char * file, int line, const char * func) {

        bool ok = result ? (val1 == val2) : (val1 != val2);
        tests_ += 1;
        errors_ += ok ? 0 : 1;

        if( (ok && !(verboseLevel_ > normal)) || verboseLevel_ == silent )
            return;

        out_ << file << ( ok ? ";" : ":" ) << line << ": ";
        out_ << ( ok ? "OK/" : "FAILED/" ) << func << "(): ";
        if( compare ) {
            const std::string cmp = ( result ? "==" : "!=" );
            out_ << "compare {" << str1 << "} " << cmp << " {" <<  str2 << "} "
                 << "got {\"" << val1 << "\"} " << cmp << " {\"" << val2 << "\"}";
        } else {
            out_ << "evaluate {" << str1 << "} == " << val1;
        }
        out_ << std::endl;
    }